

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

bool __thiscall ctemplate::UnclosedSnippetTags::MaybeRemove(UnclosedSnippetTags *this,Tag tag)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  
  pcVar2 = strchr(this->tags,tag);
  if (pcVar2 != (char *)0x0) {
    cVar3 = *pcVar2;
    pcVar1 = pcVar2;
    while (cVar3 != '\0') {
      cVar3 = pcVar1[1];
      *pcVar1 = cVar3;
      pcVar1 = pcVar1 + 1;
    }
    this->tag_length = this->tag_length + -1;
  }
  return pcVar2 != (char *)0x0;
}

Assistant:

inline bool MaybeRemove(Tag tag) {
    char* tag_location = strchr(tags, tag);
    if (tag_location) {
      for (char* c = tag_location; *c; ++c) {
        // Have to copy all later tags down by one so we don't leave a gap in the
        // array.
        *c = *(c + 1);
      }
      --tag_length;
      return true;
    } else {
      return false;
    }
  }